

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

int execute(string *executable,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args,string *input,string *output)

{
  undefined1 auVar1 [16];
  char **ppcVar2;
  int iVar3;
  __pid_t _Var4;
  int iVar5;
  __sighandler_t p_Var6;
  string *psVar7;
  int *piVar8;
  char *pcVar9;
  size_type sVar10;
  ulong uVar11;
  ostream *poVar12;
  void *__buf;
  long lVar13;
  ssize_t sVar14;
  ulong uVar15;
  bool bVar16;
  allocator<char> local_41d9;
  undefined1 local_41d8;
  allocator<char> local_41d7;
  undefined1 local_41d6;
  allocator<char> local_41d5;
  uint local_41d4;
  undefined1 local_41ce;
  allocator<char> local_41cd;
  int status;
  __suseconds_t *local_41c8;
  fd_set *__arr_1;
  __fd_mask *p_Stack_41b8;
  uint __i_1;
  fd_set *__arr;
  int local_41a8;
  uint __i;
  int rc;
  uint i;
  char **argv;
  allocator<char> local_4190;
  undefined1 local_418f;
  allocator<char> local_418e;
  undefined1 local_418d;
  allocator<char> local_4179;
  long local_4178;
  char *input_cstr;
  char local_4168 [4];
  uint written;
  char buf [16384];
  int local_15c;
  int local_158;
  int write_retval;
  int read_retval;
  int select_retval;
  timeval tv;
  fd_set wfds;
  fd_set rfds;
  int local_38;
  int pout [2];
  int pin [2];
  pid_t pid;
  string *output_local;
  string *input_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  string *executable_local;
  
  local_4178 = std::__cxx11::string::c_str();
  p_Var6 = signal(0xd,(__sighandler_t)0x1);
  if (p_Var6 == (__sighandler_t)0xffffffffffffffff) {
    local_418d = 1;
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,&local_4179);
    local_418d = 0;
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = pipe(pout);
  if (iVar3 == -1) {
    local_418f = 1;
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,&local_418e);
    local_418f = 0;
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = pipe((int *)((long)rfds.fds_bits + 0x7c));
  if (iVar3 == -1) {
    argv._7_1_ = 1;
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,&local_4190);
    argv._7_1_ = 0;
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  _Var4 = fork();
  if (_Var4 == -1) {
    argv._5_1_ = 1;
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar7,pcVar9,(allocator<char> *)((long)&argv + 6));
    argv._5_1_ = 0;
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (_Var4 == 0) {
    close(pout[1]);
    close(rfds.fds_bits[0xf]._4_4_);
    iVar3 = dup2(pout[0],0);
    if (iVar3 == -1) {
      argv._3_1_ = 1;
      psVar7 = (string *)__cxa_allocate_exception(0x20);
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (psVar7,pcVar9,(allocator<char> *)((long)&argv + 4));
      argv._3_1_ = 0;
      __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    close(pout[0]);
    iVar3 = dup2(local_38,1);
    if (iVar3 != -1) {
      close(local_38);
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(args);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar10 + 2;
      uVar11 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      _rc = (char **)operator_new__(uVar11);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      *_rc = pcVar9;
      for (__i = 0; uVar11 = (ulong)__i,
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(args), ppcVar2 = _rc, uVar11 < sVar10; __i = __i + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](args,(ulong)__i);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        _rc[__i + 1] = pcVar9;
      }
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(args);
      ppcVar2[sVar10 + 1] = (char *)0x0;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      local_41a8 = execvp(pcVar9,_rc);
      poVar12 = std::operator<<((ostream *)&std::cerr,"Failed to execute \'");
      poVar12 = std::operator<<(poVar12,(string *)executable);
      poVar12 = std::operator<<(poVar12,"\' Error: ");
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      poVar12 = std::operator<<(poVar12,pcVar9);
      std::operator<<(poVar12,'\n');
      _exit(local_41a8);
    }
    argv._1_1_ = 1;
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar7,pcVar9,(allocator<char> *)((long)&argv + 2));
    argv._1_1_ = 0;
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  close(pout[0]);
  close(local_38);
  uVar11 = std::__cxx11::string::empty();
  if ((uVar11 & 1) != 0) {
    close(pout[1]);
  }
  std::__cxx11::string::operator=((string *)output,"");
  local_158 = -1;
  input_cstr._4_4_ = 0;
  while( true ) {
    bVar16 = true;
    if (local_158 == 0) {
      uVar11 = std::__cxx11::string::size();
      bVar16 = uVar11 != input_cstr._4_4_;
    }
    if (!bVar16) break;
    p_Stack_41b8 = wfds.fds_bits + 0xf;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      p_Stack_41b8[__arr._4_4_] = 0;
    }
    if (local_158 != 0) {
      wfds.fds_bits[(long)(rfds.fds_bits[0xf]._4_4_ / 0x40) + 0xf] =
           1L << ((byte)((long)rfds.fds_bits[0xf]._4_4_ % 0x40) & 0x3f) |
           wfds.fds_bits[(long)(rfds.fds_bits[0xf]._4_4_ / 0x40) + 0xf];
    }
    local_41c8 = &tv.tv_usec;
    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
      local_41c8[__arr_1._4_4_] = 0;
    }
    uVar11 = std::__cxx11::string::size();
    if (uVar11 != input_cstr._4_4_) {
      wfds.fds_bits[(long)(pout[1] / 0x40) + -1] =
           1L << ((byte)((long)pout[1] % 0x40) & 0x3f) | wfds.fds_bits[(long)(pout[1] / 0x40) + -1];
    }
    _read_retval = 5;
    tv.tv_sec = 0;
    piVar8 = std::max<int>((int *)((long)rfds.fds_bits + 0x7c),pout + 1);
    iVar5 = select(*piVar8 + 1,(fd_set *)(wfds.fds_bits + 0xf),(fd_set *)&tv.tv_usec,(fd_set *)0x0,
                   (timeval *)&read_retval);
    iVar3 = pout[1];
    if (iVar5 == -1) {
      status._2_1_ = 1;
      psVar7 = (string *)__cxa_allocate_exception(0x20);
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (psVar7,pcVar9,(allocator<char> *)((long)&status + 3));
      status._2_1_ = 0;
      __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    if ((wfds.fds_bits[(long)(pout[1] / 0x40) + -1] & 1L << ((byte)((long)pout[1] % 0x40) & 0x3f))
        != 0) {
      __buf = (void *)(local_4178 + (ulong)input_cstr._4_4_);
      lVar13 = std::__cxx11::string::size();
      sVar14 = write(iVar3,__buf,lVar13 - (ulong)input_cstr._4_4_);
      local_15c = (int)sVar14;
      if (local_15c == -1) {
        piVar8 = __errno_location();
        if (*piVar8 != 0x20) {
          status._0_1_ = 1;
          psVar7 = (string *)__cxa_allocate_exception(0x20);
          piVar8 = __errno_location();
          pcVar9 = strerror(*piVar8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (psVar7,pcVar9,(allocator<char> *)((long)&status + 1));
          status._0_1_ = 0;
          __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        local_15c = std::__cxx11::string::size();
        local_15c = local_15c - input_cstr._4_4_;
      }
      input_cstr._4_4_ = local_15c + input_cstr._4_4_;
      uVar11 = (ulong)input_cstr._4_4_;
      uVar15 = std::__cxx11::string::size();
      if (uVar11 == uVar15) {
        close(pout[1]);
      }
    }
    if ((wfds.fds_bits[(long)(rfds.fds_bits[0xf]._4_4_ / 0x40) + 0xf] &
        1L << ((byte)((long)rfds.fds_bits[0xf]._4_4_ % 0x40) & 0x3f)) != 0) {
      sVar14 = read(rfds.fds_bits[0xf]._4_4_,local_4168,0x3fff);
      local_158 = (int)sVar14;
      if (local_158 == -1) {
        local_41ce = 1;
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,&local_41cd);
        local_41ce = 0;
        __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      local_4168[local_158] = '\0';
      std::__cxx11::string::operator+=((string *)output,local_4168);
    }
  }
  close(rfds.fds_bits[0xf]._4_4_);
  local_41d4 = 0xffffffff;
  _Var4 = wait(&local_41d4);
  if (_Var4 == -1) {
    local_41d6 = 1;
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,&local_41d5);
    local_41d6 = 0;
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if ((local_41d4 & 0x7f) != 0) {
    local_41d8 = 1;
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar7,"Error: Could not get Hook exit status!",&local_41d7);
    local_41d8 = 0;
    __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  local_41d4 = (int)(local_41d4 & 0xff00) >> 8;
  p_Var6 = signal(0xd,(__sighandler_t)0x0);
  if (p_Var6 != (__sighandler_t)0xffffffffffffffff) {
    return local_41d4;
  }
  psVar7 = (string *)__cxa_allocate_exception(0x20);
  piVar8 = __errno_location();
  pcVar9 = strerror(*piVar8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar7,pcVar9,&local_41d9);
  __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int execute (
  const std::string& executable,
  const std::vector <std::string>& args,
  const std::string& input,
  std::string& output)
{
  pid_t pid;
  int pin[2], pout[2];
  fd_set rfds, wfds;
  struct timeval tv;
  int select_retval, read_retval, write_retval;
  char buf[16384];
  unsigned int written;
  const char* input_cstr = input.c_str ();

  if (signal (SIGPIPE, SIG_IGN) == SIG_ERR) // Handled locally with EPIPE.
    throw std::string (std::strerror (errno));

  if (pipe (pin) == -1)
    throw std::string (std::strerror (errno));

  if (pipe (pout) == -1)
    throw std::string (std::strerror (errno));

  if ((pid = fork ()) == -1)
    throw std::string (std::strerror (errno));

  if (pid == 0)
  {
    // This is only reached in the child
    close (pin[1]);   // Close the write end of the input pipe.
    close (pout[0]);  // Close the read end of the output pipe.

    // Parent writes to pin[1]. Set read end pin[0] as STDIN for child.
    if (dup2 (pin[0], STDIN_FILENO) == -1)
      throw std::string (std::strerror (errno));
    close (pin[0]);

    // Parent reads from pout[0]. Set write end pout[1] as STDOUT for child.
    if (dup2 (pout[1], STDOUT_FILENO) == -1)
      throw std::string (std::strerror (errno));
    close (pout[1]);

    // Add executable as argv[0] and NULL-terminate the array for execvp().
    char** argv = new char* [args.size () + 2];
    argv[0] = (char*) executable.c_str ();
    for (unsigned int i = 0; i < args.size (); ++i)
      argv[i+1] = (char*) args[i].c_str ();

    argv[args.size () + 1] = nullptr;
    int rc = execvp (executable.c_str (), argv);
    std::cerr << "Failed to execute '" << executable << "' Error: " << strerror (errno) << '\n';
    _exit (rc);
  }

  // This is only reached in the parent
  close (pin[0]);   // Close the read end of the input pipe.
  close (pout[1]);  // Close the write end of the output pipe.

  if (input.empty ())
  {
    // Nothing to send to the child, close the pipe early.
    close (pin[1]);
  }

  output = "";
  read_retval = -1;
  written = 0;
  while (read_retval != 0 || input.size () != written)
  {
    FD_ZERO (&rfds);
    if (read_retval != 0)
      FD_SET (pout[0], &rfds);

    FD_ZERO (&wfds);
    if (input.size () != written)
      FD_SET (pin[1], &wfds);

    // On Linux, tv may be overwritten by select().  Reset it each time.
    // NOTE: Timeout chosen arbitrarily - we don't time out execute() calls.
    // select() is run over and over again unless the child exits or closes
    // its pipes.
    tv.tv_sec = 5;
    tv.tv_usec = 0;

    select_retval = select (std::max (pout[0], pin[1]) + 1, &rfds, &wfds, nullptr, &tv);

    if (select_retval == -1)
      throw std::string (std::strerror (errno));

    // Write data to child's STDIN
    if (FD_ISSET (pin[1], &wfds))
    {
      write_retval = write (pin[1], input_cstr + written, input.size () - written);
      if (write_retval == -1)
      {
        if (errno == EPIPE)
        {
          // Child died (or closed the pipe) before reading all input.
          // We don't really care; pretend we wrote it all.
          write_retval = input.size () - written;
        }
        else
        {
          throw std::string (std::strerror (errno));
        }
      }
      written += write_retval;

      if (written == input.size ())
      {
        // Let the child know that no more input is coming by closing the pipe.
        close (pin[1]);
      }
    }

    // Read data from child's STDOUT
    if (FD_ISSET (pout[0], &rfds))
    {
      read_retval = read (pout[0], &buf, sizeof (buf) - 1);
      if (read_retval == -1)
        throw std::string (std::strerror (errno));

      buf[read_retval] = '\0';
      output += buf;
    }
  }

  close (pout[0]);  // Close the read end of the output pipe.

  int status = -1;
  if (wait (&status) == -1)
    throw std::string (std::strerror (errno));

  if (WIFEXITED (status))
  {
    status = WEXITSTATUS (status);
  }
  else
  {
    throw std::string ("Error: Could not get Hook exit status!");
  }

  if (signal (SIGPIPE, SIG_DFL) == SIG_ERR)  // We're done, return to default.
    throw std::string (std::strerror (errno));

  return status;
}